

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::root_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,root_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  error_category *peVar5;
  byte *pbVar6;
  matcher<json_out_callbacks> *pmVar7;
  undefined **ppuVar8;
  _Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false> _Var9;
  error_code err;
  error_code err_00;
  string *local_38;
  deleter<pstore::json::details::matcher<json_out_callbacks>_> local_30;
  matcher<json_out_callbacks> *local_28;
  
  if (ch->valid_ == false) {
LAB_00135ca2:
    peVar5 = get_error_category();
    err_00._M_cat = peVar5;
    err_00._0_8_ = 8;
    bVar3 = parser<json_out_callbacks>::set_error(parser,err_00);
    if (bVar3) {
      (this->super_matcher<json_out_callbacks>).state_ = 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)0x0;
    __return_storage_ptr__->second = true;
    return __return_storage_ptr__;
  }
  iVar2 = (this->super_matcher<json_out_callbacks>).state_;
  if (iVar2 == 2) {
    (this->super_matcher<json_out_callbacks>).state_ = 3;
    _Var9._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    *(undefined4 *)((long)&(_Var9._M_head_impl)->terminal + 8) = 2;
    ((_Var9._M_head_impl)->terminal).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bcd20;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)&(_Var9._M_head_impl)->terminal;
    __return_storage_ptr__->second = false;
    return __return_storage_ptr__;
  }
  if (iVar2 != 3) {
    if (iVar2 == 1) {
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x696);
    }
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x698);
  }
  if (((this->super_matcher<json_out_callbacks>).field_0xc == '\x01') &&
     (pcVar4 = maybe<char,_void>::operator->(ch), *pcVar4 != '\"')) {
    peVar5 = get_error_category();
    err._M_cat = peVar5;
    err._0_8_ = 5;
    parser<json_out_callbacks>::set_error(parser,err);
  }
  (this->super_matcher<json_out_callbacks>).state_ = 1;
  pbVar6 = (byte *)maybe<char,_void>::operator->(ch);
  bVar1 = *pbVar6;
  if (0x5a < bVar1) {
    if (bVar1 < 0x6e) {
      if (bVar1 != 0x5b) {
        if (bVar1 == 0x66) {
          _Var9._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
               ._M_head_impl;
          pmVar7 = (matcher<json_out_callbacks> *)&(_Var9._M_head_impl)->terminal;
          if (pmVar7 == &this->super_matcher<json_out_callbacks>) goto LAB_00135dbd;
          *(undefined4 *)((long)&(_Var9._M_head_impl)->terminal + 8) = 2;
          ((_Var9._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bce60;
          pcVar4 = "false";
          goto LAB_00135d39;
        }
        goto LAB_00135ca2;
      }
      local_28 = (matcher<json_out_callbacks> *)operator_new(0x10);
      local_28->state_ = 2;
      ppuVar8 = &PTR__matcher_001bcee0;
    }
    else {
      if (bVar1 == 0x6e) {
        _Var9._M_head_impl =
             (parser->singletons_)._M_t.
             super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
             ._M_head_impl;
        pmVar7 = (matcher<json_out_callbacks> *)&(_Var9._M_head_impl)->terminal;
        if (pmVar7 == &this->super_matcher<json_out_callbacks>) {
LAB_00135dbd:
          assert_failed("this != parser.get_terminal_storage ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                        ,0x15b);
        }
        *(undefined4 *)((long)&(_Var9._M_head_impl)->terminal + 8) = 2;
        ((_Var9._M_head_impl)->terminal).__align =
             (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bcea0;
        pcVar4 = "null";
LAB_00135d39:
        *(char **)((long)&(_Var9._M_head_impl)->terminal + 0x10) = pcVar4;
        (__return_storage_ptr__->first)._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .
        super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .
        super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
             = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                )0x0;
        (__return_storage_ptr__->first)._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
        _M_head_impl = pmVar7;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x74) {
        _Var9._M_head_impl =
             (parser->singletons_)._M_t.
             super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
             ._M_head_impl;
        pmVar7 = (matcher<json_out_callbacks> *)&(_Var9._M_head_impl)->terminal;
        if (pmVar7 == &this->super_matcher<json_out_callbacks>) goto LAB_00135dbd;
        *(undefined4 *)((long)&(_Var9._M_head_impl)->terminal + 8) = 2;
        ((_Var9._M_head_impl)->terminal).__align =
             (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bce20;
        pcVar4 = "true";
        goto LAB_00135d39;
      }
      if (bVar1 != 0x7b) goto LAB_00135ca2;
      local_28 = (matcher<json_out_callbacks> *)operator_new(0x10);
      local_28->state_ = 2;
      ppuVar8 = &PTR__matcher_001bcf20;
    }
    local_28->_vptr_matcher = (_func_int **)ppuVar8;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
            )0x1;
    goto LAB_00135bdb;
  }
  if (bVar1 - 0x30 < 10) {
LAB_00135bbd:
    matcher<json_out_callbacks>::
    make_terminal_matcher<pstore::json::details::number_matcher<json_out_callbacks>>
              ((matcher<json_out_callbacks> *)&local_30,(parser<json_out_callbacks> *)this);
  }
  else {
    if (bVar1 != 0x22) {
      if (bVar1 != 0x2d) goto LAB_00135ca2;
      goto LAB_00135bbd;
    }
    local_38 = &parser->string_;
    matcher<json_out_callbacks>::
    make_terminal_matcher<pstore::json::details::string_matcher<json_out_callbacks>,std::__cxx11::string*,bool_const&>
              ((matcher<json_out_callbacks> *)&local_30,(parser<json_out_callbacks> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)parser,
               (bool *)&local_38);
  }
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
          )local_30.delete_;
LAB_00135bdb:
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       local_28;
  __return_storage_ptr__->second = false;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            root_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_token);
                    return {nullptr, true};
                }

                switch (this->get_state ()) {
                case start_state:
                    this->set_state (new_token_state);
                    return {this->make_whitespace_matcher (parser), false};

                case new_token_state: {
                    if (object_key_ && *ch != '"') {
                        this->set_error (parser, error_code::expected_string);
                        // Don't return here in order to allow the switch default to produce a
                        // different error code for a bad token.
                    }
                    this->set_state (done_state);
                    switch (*ch) {
                    case '-':
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return {this->template make_terminal_matcher<number_matcher<Callbacks>> (
                                    parser),
                                false};
                    case '"':
                        return {this->template make_terminal_matcher<string_matcher<Callbacks>> (
                                    parser, &parser.string_, object_key_),
                                false};
                    case 't':
                        return {
                            this->template make_terminal_matcher<true_token_matcher<Callbacks>> (
                                parser, "true"),
                            false};
                    case 'f':
                        return {
                            this->template make_terminal_matcher<false_token_matcher<Callbacks>> (
                                parser, "false"),
                            false};
                    case 'n':
                        return {
                            this->template make_terminal_matcher<null_token_matcher<Callbacks>> (
                                parser, "null"),
                            false};
                    case '[':
                        return {
                            typename matcher<Callbacks>::pointer (new array_matcher<Callbacks> ()),
                            false};
                    case '{':
                        return {
                            typename matcher<Callbacks>::pointer (new object_matcher<Callbacks> ()),
                            false};
                    default:
                        this->set_error (parser, error_code::expected_token);
                        return {nullptr, true};
                    }
                } break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                PSTORE_ASSERT (false); // unreachable.
                return {nullptr, true};
            }